

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

HANDLE CreateEventA(LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,BOOL bInitialState,
                   LPCSTR lpName)

{
  CPalThread *pthr_00;
  DWORD local_34;
  PAL_ERROR palError;
  CPalThread *pthr;
  HANDLE hEvent;
  LPCSTR lpName_local;
  BOOL bInitialState_local;
  BOOL bManualReset_local;
  LPSECURITY_ATTRIBUTES lpEventAttributes_local;
  
  pthr = (CPalThread *)0x0;
  hEvent = lpName;
  lpName_local._0_4_ = bInitialState;
  lpName_local._4_4_ = bManualReset;
  _bInitialState_local = lpEventAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  if (hEvent == (HANDLE)0x0) {
    local_34 = CorUnix::InternalCreateEvent
                         (pthr_00,_bInitialState_local,lpName_local._4_4_,(BOOL)lpName_local,
                          (LPCWSTR)0x0,&pthr);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateEventA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x69);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_34 = 0x32;
  }
  CorUnix::CPalThread::SetLastError(local_34);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pthr;
}

Assistant:

HANDLE
PALAPI
CreateEventA(
         IN LPSECURITY_ATTRIBUTES lpEventAttributes,
         IN BOOL bManualReset,
         IN BOOL bInitialState,
         IN LPCSTR lpName)
{
    HANDLE hEvent = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(CreateEventA);
    ENTRY("CreateEventA(lpEventAttr=%p, bManualReset=%d, bInitialState=%d, lpName=%p (%s)\n",
          lpEventAttributes, bManualReset, bInitialState, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();
    
    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateEvent(
            pthr,
            lpEventAttributes,
            bManualReset,
            bInitialState,
            NULL,
            &hEvent
            );
    }

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);
    
    LOGEXIT("CreateEventA returns HANDLE %p\n", hEvent);
    PERF_EXIT(CreateEventA);
    return hEvent;
}